

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImVector<ImGuiWindow_*> *in_RSI;
  ImGuiWindow *child;
  int i;
  int count;
  ImGuiWindow **in_stack_ffffffffffffffd8;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffe0;
  int i_00;
  int iVar2;
  
  ImVector<ImGuiWindow_*>::push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if ((in_RSI[8].Capacity & 0x10000) != 0) {
    iVar2 = in_RSI[0x19].Size;
    if (1 < iVar2) {
      qsort(in_RSI[0x19].Data,(long)iVar2,8,ChildWindowComparer);
    }
    for (i_00 = 0; i_00 < iVar2; i_00 = i_00 + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](in_RSI + 0x19,i_00);
      if (((*ppIVar1)->Active & 1U) != 0) {
        AddWindowToSortBuffer(in_RSI,(ImGuiWindow *)CONCAT44(iVar2,i_00));
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}